

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_3_lambda(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_LAMBDA,G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_3_lambda(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define p G->val[-2]
  yyprintf((stderr, "do yy_3_lambda"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_LAMBDA, b); }\n"));
  yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_LAMBDA, b); ;
#undef b
#undef p
}